

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallProgramsCommand.cxx
# Opt level: O1

string * FindInstallSource_abi_cxx11_
                   (string *__return_storage_ptr__,cmMakefile *makefile,char *name)

{
  bool bVar1;
  size_type sVar2;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string ts;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined8 local_90;
  undefined1 *local_88;
  undefined1 local_80 [32];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined8 local_50;
  undefined1 *local_48;
  size_t local_40;
  char *local_38;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(name);
  bVar6 = true;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,name,&local_f1);
    sVar2 = cmGeneratorExpression::Find(&local_b0);
    bVar6 = sVar2 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,name,(allocator<char> *)&local_60);
    return __return_storage_ptr__;
  }
  psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(makefile);
  local_60._M_str = (psVar3->_M_dataplus)._M_p;
  local_60._M_len = psVar3->_M_string_length;
  local_90 = 1;
  local_80[0] = 0x2f;
  local_50 = 1;
  local_88 = local_80;
  local_48 = local_80;
  local_40 = strlen(name);
  views._M_len = 3;
  views._M_array = &local_60;
  local_38 = name;
  cmCatViews_abi_cxx11_(&local_f0,views);
  psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(makefile);
  local_60._M_str = (psVar3->_M_dataplus)._M_p;
  local_60._M_len = psVar3->_M_string_length;
  local_90 = 1;
  local_80[0] = 0x2f;
  local_50 = 1;
  local_88 = local_80;
  local_48 = local_80;
  local_40 = strlen(name);
  views_00._M_len = 3;
  views_00._M_array = &local_60;
  local_38 = name;
  cmCatViews_abi_cxx11_(&local_d0,views_00);
  bVar6 = cmsys::SystemTools::FileExists(&local_f0);
  if (bVar6) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    bVar6 = cmsys::SystemTools::FileExists(&local_d0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar6) {
      paVar4 = &local_d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar4) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_d0.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d0.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_d0._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_d0.field_2._M_allocated_capacity;
      }
      psVar3 = &local_d0;
      goto LAB_0029cc19;
    }
  }
  paVar4 = &local_f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == paVar4) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_f0.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_f0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_f0.field_2._M_allocated_capacity
    ;
  }
  psVar3 = &local_f0;
LAB_0029cc19:
  psVar5 = &psVar3->_M_string_length;
  __return_storage_ptr__->_M_string_length = *psVar5;
  (((string *)(psVar5 + -1))->_M_dataplus)._M_p = (pointer)paVar4;
  *psVar5 = 0;
  paVar4->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FindInstallSource(cmMakefile& makefile, const char* name)
{
  if (cmSystemTools::FileIsFullPath(name) ||
      cmGeneratorExpression::Find(name) == 0) {
    // This is a full path.
    return name;
  }

  // This is a relative path.
  std::string tb = cmStrCat(makefile.GetCurrentBinaryDirectory(), '/', name);
  std::string ts = cmStrCat(makefile.GetCurrentSourceDirectory(), '/', name);

  if (cmSystemTools::FileExists(tb)) {
    // The file exists in the binary tree.  Use it.
    return tb;
  }
  if (cmSystemTools::FileExists(ts)) {
    // The file exists in the source tree.  Use it.
    return ts;
  }
  // The file doesn't exist.  Assume it will be present in the
  // binary tree when the install occurs.
  return tb;
}